

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

span<const_lf::mesh::Entity_*const,_18446744073709551615UL> __thiscall
lf::mesh::hybrid2d::Mesh::Entities(Mesh *this,uint codim)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppEVar3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> sVar4;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (codim <= this->dim_world_) {
    ppEVar3 = (this->entity_pointers_)._M_elems[codim].
              super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar4._M_extent._M_extent_value =
         (long)(this->entity_pointers_)._M_elems[codim].
               super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3;
    sVar4._M_ptr = ppEVar3;
    return sVar4;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"codim > dimWorld.",0x11);
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"codim <= dim_world_","");
  paVar2 = &local_208.field_2;
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e8,&local_208,0x16,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"false","");
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
             ,"");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  base::AssertionFailed(&local_1e8,&local_208,0x16,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  abort();
}

Assistant:

std::span<const Entity *const> Mesh::Entities(unsigned codim) const {
  LF_ASSERT_MSG(codim >= 0, "codim negative.");
  LF_ASSERT_MSG(codim <= dim_world_, "codim > dimWorld.");

  return entity_pointers_[codim];

  // auto l = [&](auto i) -> const mesh::Entity & { return **i; };
  // switch (codim) {
  //   case 0: {
  //     return {base::make_DereferenceLambdaRandomAccessIterator(
  //                 entity_pointers_[0].begin(), l),
  //             base::make_DereferenceLambdaRandomAccessIterator(
  //                 entity_pointers_[0].end(), l)};
  //   }
  //   case 1:
  //     //return {segments_.begin(), segments_.end()};
  //   case 2:
  //     return {points_.begin(), points_.end()};
  //   default: {
  //     LF_VERIFY_MSG(false, "Something is horribly wrong, codim = " +
  //                              std::to_string(codim) + " is out of bounds.");
  //     return {
  //         base::ForwardIterator<const Entity>(static_cast<Entity
  //         *>(nullptr)), base::ForwardIterator<const
  //         Entity>(static_cast<Entity *>(nullptr))};
  //   }
  // }
}